

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O3

double __thiscall RBTS<TTA>::Alloc(RBTS<TTA> *this)

{
  int iVar1;
  int iVar2;
  Mat1b *pMVar3;
  int *piVar4;
  Mat1i *pMVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  long lVar10;
  size_t capacity;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double local_d8;
  double dStack_d0;
  Mat local_80 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar3->field_0x8;
  iVar2 = *(int *)&pMVar3->field_0xc;
  dVar6 = TTA::Alloc(((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) *
                     ((iVar1 - (iVar1 + 1 >> 0x1f)) + 1 >> 1) + 1,
                     &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  lVar10 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar10;
  piVar4 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_80,*piVar4,piVar4[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_80);
  cv::Mat::~Mat(local_80);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  lVar10 = cv::getTickCount();
  dVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  dVar11 = (double)lVar10 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar11;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar11;
  lVar10 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar10;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar5->field_0x10,0,*(long *)&pMVar5->field_0x20 - *(long *)&pMVar5->field_0x18
        );
  lVar10 = cv::getTickCount();
  dVar12 = (double)lVar10 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar12;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar12;
  dVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  lVar10 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar10;
  capacity = (size_t)(*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc
                      / 2 + 2);
  CircularBuffer<int>::Create(&this->s_queue_,capacity);
  CircularBuffer<int>::Create(&this->e_queue_,capacity);
  memset((this->s_queue_).buffer_,0,capacity);
  memset((this->e_queue_).buffer_,0,capacity);
  lVar10 = cv::getTickCount();
  dVar7 = (double)lVar10 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar7;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar7 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  auVar13._0_8_ = dVar11 * 1000.0;
  auVar13._8_8_ = dVar7 * 1000.0;
  dVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar14._8_4_ = SUB84(dVar7,0);
  auVar14._0_8_ = dVar8;
  auVar14._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar14 = divpd(auVar13,auVar14);
  lVar10 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar10;
  memset((this->s_queue_).buffer_,0,capacity);
  memset((this->e_queue_).buffer_,0,capacity);
  lVar10 = cv::getTickCount();
  dVar7 = (double)lVar10 -
          (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar7;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       dVar7 + (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.
               total;
  auVar15._0_8_ = dVar12 * 1000.0;
  auVar15._8_8_ = dVar7 * 1000.0;
  dVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  auVar16._8_4_ = SUB84(dVar7,0);
  auVar16._0_8_ = dVar9;
  auVar16._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar16 = divpd(auVar15,auVar16);
  local_d8 = auVar14._0_8_;
  dStack_d0 = auVar14._8_8_;
  return (dStack_d0 - auVar16._8_8_) + dVar6 + (local_d8 - auVar16._0_8_);
}

Assistant:

double Alloc()
    {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);
        // Memory allocation for the output image
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double t = perf_.last();
        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        perf_.stop();
        double ma_t = t - perf_.last();

        perf_.start();
        int w(img_.cols); // w = N in the paper naming convention
        // Circular Buffers
        int buffer_capacity = w / 2 + 2;
        s_queue_.Create(buffer_capacity);
        e_queue_.Create(buffer_capacity);
        memset(s_queue_.buffer_, 0, buffer_capacity);
        memset(e_queue_.buffer_, 0, buffer_capacity);
        perf_.stop();
        double qu_t = perf_.last();
        perf_.start();
        memset(s_queue_.buffer_, 0, buffer_capacity);
        memset(e_queue_.buffer_, 0, buffer_capacity);
        perf_.stop();
        qu_t -= perf_.last();

        // Return total time
        return ls_t + ma_t + qu_t;
    }